

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O2

int __thiscall lattice::supercell::init(supercell *this,EVP_PKEY_CTX *ctx)

{
  span_t *dst;
  offset_t *dst_00;
  long *plVar1;
  long *plVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  logic_error *this_00;
  long lVar7;
  ulong uVar8;
  code *pcVar9;
  ulong uVar10;
  size_type __new_size;
  undefined *puVar11;
  long *plVar12;
  size_t m;
  ulong uVar13;
  long lVar14;
  long *plVar15;
  Scalar SVar16;
  ulong local_50;
  offset_t c;
  
  dst = &this->span_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<long,_1,_1,0,_1,_1>,Eigen::Matrix<long,_1,_1,0,_1,_1>>
            (dst,(Matrix<long,__1,__1,_0,__1,__1> *)ctx);
  sVar6 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if (sVar6 == (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows) {
    this->dim_ = sVar6;
    c.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data = (long *)dst;
    SVar16 = Eigen::
             MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>
             ::determinant((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>
                            *)&c);
    uVar5 = (ulong)(ABS(SVar16) + 0.5);
    this->num_cells_ =
         (long)((ABS(SVar16) + 0.5) - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    c.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data = (long *)dst;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,double>,Eigen::Matrix<long,_1,_1,0,_1,_1>const>>>
              (&this->rs_,
               (Inverse<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>
                *)&c);
    c.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (long *)this->dim_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<long,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,Eigen::Matrix<long,_1,1,0,_1,1>>>
              (&this->nmin_,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                *)&c);
    c.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (long *)this->dim_;
    dst_00 = &this->nmax_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<long,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,Eigen::Matrix<long,_1,1,0,_1,1>>>
              (dst_00,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<long>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                       *)&c);
    uVar5 = this->dim_;
    uVar8 = 0;
    while( true ) {
      plVar1 = (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if ((ulong)(long)(1 << ((byte)uVar5 & 0x1f)) <= uVar8) break;
      plVar12 = (dst->super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>).m_storage.
                m_data;
      plVar2 = (dst_00->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      for (uVar13 = 0; uVar13 < uVar5; uVar13 = uVar13 + 1) {
        lVar14 = 0;
        plVar15 = plVar12;
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          if ((uVar8 >> (uVar10 & 0x3f) & 1) == 0) {
            lVar7 = 0;
          }
          else {
            lVar7 = *plVar15;
          }
          lVar14 = lVar14 + lVar7;
          plVar15 = plVar15 + (this->span_).
                              super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
        }
        lVar7 = plVar1[uVar13];
        if (lVar14 < plVar1[uVar13]) {
          lVar7 = lVar14;
        }
        plVar1[uVar13] = lVar7;
        lVar7 = plVar2[uVar13];
        if (lVar14 < lVar7) {
          lVar14 = lVar7;
        }
        plVar2[uVar13] = lVar14;
        uVar5 = this->dim_;
        plVar12 = plVar12 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    __new_size = 1;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      __new_size = __new_size *
                   ((dst_00->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage
                    .m_data[uVar8] - plVar1[uVar8]);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->lcord2index_,__new_size);
    puVar3 = (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar3;
    }
    for (local_50 = 0;
        local_50 <
        (ulong)((long)(this->lcord2index_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->lcord2index_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3); local_50 = local_50 + 1) {
      lcord2offset((supercell *)&c,(size_t)this);
      bVar4 = within_supercell(this,&c);
      if (bVar4) {
        (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[local_50] =
             (long)(this->index2lcord_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->index2lcord_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->index2lcord_,&local_50);
      }
      free(c.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    }
    sVar6 = (long)(this->index2lcord_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->index2lcord_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (this->num_cells_ == sVar6) {
      return (int)sVar6;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"supercell::init() internal error");
    puVar11 = &std::logic_error::typeinfo;
    pcVar9 = std::logic_error::~logic_error;
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"invalid shape of span matrix");
    puVar11 = &std::invalid_argument::typeinfo;
    pcVar9 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar11,pcVar9);
}

Assistant:

void init(const span_t& span) {
    span_ = span;
    if (span_.cols() != span_.rows())
      throw std::invalid_argument("invalid shape of span matrix");
    dim_ = span_.cols();
    num_cells_ = std::size_t(std::abs(span_.cast<double>().determinant()) + 0.5);
    rs_ = span_.cast<double>().inverse();

    nmin_ = offset_t::Zero(dim_);
    nmax_ = offset_t::Zero(dim_);
    for (std::size_t i = 0; i < std::size_t(1 << dim_); ++i) {
      for (std::size_t m = 0; m < dim_; ++m) {
        long v = 0;
        for (std::size_t n = 0; n < dim_; ++n) v += ((i >> n) & 1) * span_(m, n);
        nmin_(m) = std::min(nmin_(m), v);
        nmax_(m) = std::max(nmax_(m), v);
      }
    }
    
    std::size_t lcord_max = 1;
    for (std::size_t m = 0; m < dim_; ++m) lcord_max *= (nmax_(m) - nmin_(m));
    lcord2index_.resize(lcord_max);
    index2lcord_.clear();
    for (std::size_t i = 0; i < lcord2index_.size(); ++i) {
      offset_t c = lcord2offset(i);
      if (within_supercell(c)) {
        lcord2index_[i] = index2lcord_.size();
        index2lcord_.push_back(i);
      }
    }
    if (num_cells_ != index2lcord_.size())
      throw std::logic_error("supercell::init() internal error");
  }